

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

int adjust_hdr_cr_deltaq(int base_qindex)

{
  ulong uVar1;
  double dVar2;
  double local_38;
  double local_30;
  int local_28;
  int dqpCr;
  double dcrQP;
  double chromaQp;
  double baseQp;
  int base_qindex_local;
  
  dVar2 = (((double)base_qindex / 2.0) * -0.46 + 9.26) * 1.04 * 2.0;
  uVar1 = -(ulong)(dVar2 < 0.0);
  local_28 = (int)(dVar2 + (double)(~uVar1 & 0x3fe0000000000000 |
                                   (ulong)((uint)(uVar1 >> 0x20) & 0xbfe00000) << 0x20));
  if (0 < local_28) {
    local_28 = 0;
  }
  if (-24.0 <= (double)local_28) {
    if ((double)local_28 <= 24.0) {
      local_38 = (double)local_28;
    }
    else {
      local_38 = 24.0;
    }
    local_30 = local_38;
  }
  else {
    local_30 = -24.0;
  }
  return (int)local_30;
}

Assistant:

static int adjust_hdr_cr_deltaq(int base_qindex) {
  double baseQp = base_qindex / QP_SCALE_FACTOR;
  const double chromaQp = CHROMA_QP_SCALE * baseQp + CHROMA_QP_OFFSET;
  const double dcrQP = CHROMA_CR_QP_SCALE * chromaQp * QP_SCALE_FACTOR;
  int dqpCr = (int)(dcrQP + (dcrQP < 0 ? -0.5 : 0.5));
  dqpCr = AOMMIN(0, dqpCr);
  dqpCr = (int)CLIP(dqpCr, -12 * QP_SCALE_FACTOR, 12 * QP_SCALE_FACTOR);
  return dqpCr;
}